

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_3_2::anon_unknown_2::interleaveByte2(char *dst,char *src0,char *src1,int numBytes)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined8 *puVar6;
  int *piVar7;
  int in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  int x_6;
  __m128i tmpSrc1_epi8;
  __m128i tmpSrc0_epi8;
  int x_5;
  int x_4;
  int x_3;
  int x_2;
  int x_1;
  int x;
  __m128i tmp1;
  __m128i tmp0;
  int sseWidth;
  __m128i *src1_epi8;
  __m128i *src0_epi8;
  __m128i *dst_epi8;
  int src1Alignment;
  int src0Alignment;
  int dstAlignment;
  int local_23c;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1cc;
  undefined4 local_1b0;
  undefined4 local_1ac;
  uint local_1a8;
  int local_1a4;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 local_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  local_1a8 = (uint)in_RDI & 0xf;
  local_1cc = in_ECX / 0x10;
  if ((((in_RDI & 0xf) == 0) && ((in_RSI & 0xf) == 0)) && ((in_RDX & 0xf) == 0)) {
    for (local_1fc = 0; local_1fc < local_1cc; local_1fc = local_1fc + 1) {
      puVar6 = (undefined8 *)(in_RSI + (long)local_1fc * 0x10);
      uVar1 = *puVar6;
      uVar2 = puVar6[1];
      puVar6 = (undefined8 *)(in_RDX + (long)local_1fc * 0x10);
      uVar3 = *puVar6;
      uVar4 = puVar6[1];
      puVar6 = (undefined8 *)(in_RDI + (long)(local_1fc * 2) * 0x10);
      local_b8 = (undefined1)uVar1;
      uStack_b7 = (undefined1)((ulong)uVar1 >> 8);
      uStack_b6 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_b5 = (undefined1)((ulong)uVar1 >> 0x18);
      uStack_b4 = (undefined1)((ulong)uVar1 >> 0x20);
      uStack_b3 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_b2 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_b1 = (undefined1)((ulong)uVar1 >> 0x38);
      local_c8 = (undefined1)uVar3;
      uStack_c7 = (undefined1)((ulong)uVar3 >> 8);
      uStack_c6 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_c5 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_c4 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_c3 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_c2 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_c1 = (undefined1)((ulong)uVar3 >> 0x38);
      *puVar6 = CONCAT17(uStack_c5,
                         CONCAT16(uStack_b5,
                                  CONCAT15(uStack_c6,
                                           CONCAT14(uStack_b6,
                                                    CONCAT13(uStack_c7,
                                                             CONCAT12(uStack_b7,
                                                                      CONCAT11(local_c8,local_b8))))
                                          )));
      puVar6[1] = CONCAT17(uStack_c1,
                           CONCAT16(uStack_b1,
                                    CONCAT15(uStack_c2,
                                             CONCAT14(uStack_b2,
                                                      CONCAT13(uStack_c3,
                                                               CONCAT12(uStack_b3,
                                                                        CONCAT11(uStack_c4,uStack_b4
                                                                                )))))));
      puVar6 = (undefined8 *)(in_RDI + 0x10 + (long)(local_1fc * 2) * 0x10);
      uStack_50 = (undefined1)uVar2;
      uStack_4f = (undefined1)((ulong)uVar2 >> 8);
      uStack_4e = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_4d = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_4c = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_4b = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_4a = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_49 = (undefined1)((ulong)uVar2 >> 0x38);
      uStack_60 = (undefined1)uVar4;
      uStack_5f = (undefined1)((ulong)uVar4 >> 8);
      uStack_5e = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_5d = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_5c = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_5b = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_5a = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_59 = (undefined1)((ulong)uVar4 >> 0x38);
      *puVar6 = CONCAT17(uStack_5d,
                         CONCAT16(uStack_4d,
                                  CONCAT15(uStack_5e,
                                           CONCAT14(uStack_4e,
                                                    CONCAT13(uStack_5f,
                                                             CONCAT12(uStack_4f,
                                                                      CONCAT11(uStack_60,uStack_50))
                                                            )))));
      puVar6[1] = CONCAT17(uStack_59,
                           CONCAT16(uStack_49,
                                    CONCAT15(uStack_5a,
                                             CONCAT14(uStack_4a,
                                                      CONCAT13(uStack_5b,
                                                               CONCAT12(uStack_4b,
                                                                        CONCAT11(uStack_5c,uStack_4c
                                                                                )))))));
    }
    for (local_200 = local_1cc << 4; local_200 < in_ECX; local_200 = local_200 + 1) {
      *(undefined1 *)(in_RDI + (long)(local_200 << 1)) = *(undefined1 *)(in_RSI + (long)local_200);
      *(undefined1 *)(in_RDI + (long)(local_200 * 2 + 1)) =
           *(undefined1 *)(in_RDX + (long)local_200);
    }
  }
  else if ((((in_RDI & 0xf) == 0) && (((uint)in_RSI & 0xf) == 8)) && (((uint)in_RDX & 0xf) == 8)) {
    local_204 = 0;
    local_1ac = 8;
    local_1b0 = 8;
    local_1a4 = in_ECX;
    local_1a0 = in_RDX;
    local_198 = in_RSI;
    local_190 = in_RDI;
    while( true ) {
      iVar5 = local_204;
      local_208 = 8;
      piVar7 = std::min<int>(&local_1a4,&local_208);
      if (*piVar7 <= iVar5) break;
      *(undefined1 *)(local_190 + (long)(local_204 << 1)) =
           *(undefined1 *)(local_198 + (long)local_204);
      *(undefined1 *)(local_190 + (long)(local_204 * 2 + 1)) =
           *(undefined1 *)(local_1a0 + (long)local_204);
      local_204 = local_204 + 1;
    }
    if (8 < local_1a4) {
      iVar5 = (local_1a4 + -8) / 0x10;
      for (local_20c = 0; local_20c < iVar5; local_20c = local_20c + 1) {
        puVar6 = (undefined8 *)(local_190 + 0x10 + (long)(local_20c * 2) * 0x10);
        uVar1 = *(undefined8 *)(local_198 + 8 + (long)local_20c * 0x10);
        uVar2 = *(undefined8 *)(local_1a0 + 8 + (long)local_20c * 0x10);
        local_d8 = (undefined1)uVar1;
        uStack_d7 = (undefined1)((ulong)uVar1 >> 8);
        uStack_d6 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_d5 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_d4 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_d3 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_d2 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_d1 = (undefined1)((ulong)uVar1 >> 0x38);
        local_e8 = (undefined1)uVar2;
        uStack_e7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_e6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_e5 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_e4 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_e3 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_e2 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_e1 = (undefined1)((ulong)uVar2 >> 0x38);
        *puVar6 = CONCAT17(uStack_e5,
                           CONCAT16(uStack_d5,
                                    CONCAT15(uStack_e6,
                                             CONCAT14(uStack_d6,
                                                      CONCAT13(uStack_e7,
                                                               CONCAT12(uStack_d7,
                                                                        CONCAT11(local_e8,local_d8))
                                                              )))));
        puVar6[1] = CONCAT17(uStack_e1,
                             CONCAT16(uStack_d1,
                                      CONCAT15(uStack_e2,
                                               CONCAT14(uStack_d2,
                                                        CONCAT13(uStack_e3,
                                                                 CONCAT12(uStack_d3,
                                                                          CONCAT11(uStack_e4,
                                                                                   uStack_d4)))))));
        puVar6 = (undefined8 *)(local_190 + 0x20 + (long)(local_20c * 2) * 0x10);
        uVar1 = *(undefined8 *)(local_198 + 8 + (long)local_20c * 0x10 + 8);
        uVar2 = *(undefined8 *)(local_1a0 + 8 + (long)local_20c * 0x10 + 8);
        uStack_70 = (undefined1)uVar1;
        uStack_6f = (undefined1)((ulong)uVar1 >> 8);
        uStack_6e = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_6d = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_6c = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_6b = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_6a = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_69 = (undefined1)((ulong)uVar1 >> 0x38);
        uStack_80 = (undefined1)uVar2;
        uStack_7f = (undefined1)((ulong)uVar2 >> 8);
        uStack_7e = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_7d = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_7c = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_7b = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_7a = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_79 = (undefined1)((ulong)uVar2 >> 0x38);
        *puVar6 = CONCAT17(uStack_7d,
                           CONCAT16(uStack_6d,
                                    CONCAT15(uStack_7e,
                                             CONCAT14(uStack_6e,
                                                      CONCAT13(uStack_7f,
                                                               CONCAT12(uStack_6f,
                                                                        CONCAT11(uStack_80,uStack_70
                                                                                )))))));
        puVar6[1] = CONCAT17(uStack_79,
                             CONCAT16(uStack_69,
                                      CONCAT15(uStack_7a,
                                               CONCAT14(uStack_6a,
                                                        CONCAT13(uStack_7b,
                                                                 CONCAT12(uStack_6b,
                                                                          CONCAT11(uStack_7c,
                                                                                   uStack_6c)))))));
      }
      for (local_210 = iVar5 * 0x10 + 8; local_210 < local_1a4; local_210 = local_210 + 1) {
        *(undefined1 *)(local_190 + (long)(local_210 << 1)) =
             *(undefined1 *)(local_198 + (long)local_210);
        *(undefined1 *)(local_190 + (long)(local_210 * 2 + 1)) =
             *(undefined1 *)(local_1a0 + (long)local_210);
      }
    }
  }
  else {
    for (local_214 = 0; local_214 < local_1cc; local_214 = local_214 + 1) {
      puVar6 = (undefined8 *)(in_RSI + (long)local_214 * 0x10);
      uVar1 = *puVar6;
      uVar2 = puVar6[1];
      puVar6 = (undefined8 *)(in_RDX + (long)local_214 * 0x10);
      uVar3 = *puVar6;
      uVar4 = puVar6[1];
      puVar6 = (undefined8 *)(in_RDI + (long)(local_214 * 2) * 0x10);
      local_f8 = (undefined1)uVar1;
      uStack_f7 = (undefined1)((ulong)uVar1 >> 8);
      uStack_f6 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_f5 = (undefined1)((ulong)uVar1 >> 0x18);
      uStack_f4 = (undefined1)((ulong)uVar1 >> 0x20);
      uStack_f3 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_f2 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_f1 = (undefined1)((ulong)uVar1 >> 0x38);
      local_108 = (undefined1)uVar3;
      uStack_107 = (undefined1)((ulong)uVar3 >> 8);
      uStack_106 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_105 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_104 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_103 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_102 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_101 = (undefined1)((ulong)uVar3 >> 0x38);
      *puVar6 = CONCAT17(uStack_105,
                         CONCAT16(uStack_f5,
                                  CONCAT15(uStack_106,
                                           CONCAT14(uStack_f6,
                                                    CONCAT13(uStack_107,
                                                             CONCAT12(uStack_f7,
                                                                      CONCAT11(local_108,local_f8)))
                                                   ))));
      puVar6[1] = CONCAT17(uStack_101,
                           CONCAT16(uStack_f1,
                                    CONCAT15(uStack_102,
                                             CONCAT14(uStack_f2,
                                                      CONCAT13(uStack_103,
                                                               CONCAT12(uStack_f3,
                                                                        CONCAT11(uStack_104,
                                                                                 uStack_f4)))))));
      puVar6 = (undefined8 *)(in_RDI + 0x10 + (long)(local_214 * 2) * 0x10);
      uStack_90 = (undefined1)uVar2;
      uStack_8f = (undefined1)((ulong)uVar2 >> 8);
      uStack_8e = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_8d = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_8c = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_8b = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_8a = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_89 = (undefined1)((ulong)uVar2 >> 0x38);
      uStack_a0 = (undefined1)uVar4;
      uStack_9f = (undefined1)((ulong)uVar4 >> 8);
      uStack_9e = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_9d = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_9c = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_9b = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_9a = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_99 = (undefined1)((ulong)uVar4 >> 0x38);
      *puVar6 = CONCAT17(uStack_9d,
                         CONCAT16(uStack_8d,
                                  CONCAT15(uStack_9e,
                                           CONCAT14(uStack_8e,
                                                    CONCAT13(uStack_9f,
                                                             CONCAT12(uStack_8f,
                                                                      CONCAT11(uStack_a0,uStack_90))
                                                            )))));
      puVar6[1] = CONCAT17(uStack_99,
                           CONCAT16(uStack_89,
                                    CONCAT15(uStack_9a,
                                             CONCAT14(uStack_8a,
                                                      CONCAT13(uStack_9b,
                                                               CONCAT12(uStack_8b,
                                                                        CONCAT11(uStack_9c,uStack_8c
                                                                                )))))));
    }
    for (local_23c = local_1cc << 4; local_23c < in_ECX; local_23c = local_23c + 1) {
      *(undefined1 *)(in_RDI + (long)(local_23c << 1)) = *(undefined1 *)(in_RSI + (long)local_23c);
      *(undefined1 *)(in_RDI + (long)(local_23c * 2 + 1)) =
           *(undefined1 *)(in_RDX + (long)local_23c);
    }
  }
  return;
}

Assistant:

void
interleaveByte2 (char* dst, char* src0, char* src1, int numBytes)
{
    int dstAlignment  = (size_t) dst % 16;
    int src0Alignment = (size_t) src0 % 16;
    int src1Alignment = (size_t) src1 % 16;

    __m128i* dst_epi8  = (__m128i*) dst;
    __m128i* src0_epi8 = (__m128i*) src0;
    __m128i* src1_epi8 = (__m128i*) src1;
    int      sseWidth  = numBytes / 16;

    if ((!dstAlignment) && (!src0Alignment) && (!src1Alignment))
    {
        __m128i tmp0, tmp1;

        //
        // Aligned loads and stores
        //

        for (int x = 0; x < sseWidth; ++x)
        {
            tmp0 = src0_epi8[x];
            tmp1 = src1_epi8[x];

            _mm_stream_si128 (&dst_epi8[2 * x], _mm_unpacklo_epi8 (tmp0, tmp1));

            _mm_stream_si128 (
                &dst_epi8[2 * x + 1], _mm_unpackhi_epi8 (tmp0, tmp1));
        }

        //
        // Then do run the leftovers one at a time
        //

        for (int x = 16 * sseWidth; x < numBytes; ++x)
        {
            dst[2 * x]     = src0[x];
            dst[2 * x + 1] = src1[x];
        }
    }
    else if ((!dstAlignment) && (src0Alignment == 8) && (src1Alignment == 8))
    {
        //
        // Aligned stores, but catch up a few values so we can
        // use aligned loads
        //

        for (int x = 0; x < std::min (numBytes, 8); ++x)
        {
            dst[2 * x]     = src0[x];
            dst[2 * x + 1] = src1[x];
        }

        if (numBytes > 8)
        {
            dst_epi8  = (__m128i*) &dst[16];
            src0_epi8 = (__m128i*) &src0[8];
            src1_epi8 = (__m128i*) &src1[8];
            sseWidth  = (numBytes - 8) / 16;

            for (int x = 0; x < sseWidth; ++x)
            {
                _mm_stream_si128 (
                    &dst_epi8[2 * x],
                    _mm_unpacklo_epi8 (src0_epi8[x], src1_epi8[x]));

                _mm_stream_si128 (
                    &dst_epi8[2 * x + 1],
                    _mm_unpackhi_epi8 (src0_epi8[x], src1_epi8[x]));
            }

            //
            // Then do run the leftovers one at a time
            //

            for (int x = 16 * sseWidth + 8; x < numBytes; ++x)
            {
                dst[2 * x]     = src0[x];
                dst[2 * x + 1] = src1[x];
            }
        }
    }
    else
    {
        //
        // Unaligned everything
        //

        for (int x = 0; x < sseWidth; ++x)
        {
            __m128i tmpSrc0_epi8 = _mm_loadu_si128 (&src0_epi8[x]);
            __m128i tmpSrc1_epi8 = _mm_loadu_si128 (&src1_epi8[x]);

            _mm_storeu_si128 (
                &dst_epi8[2 * x],
                _mm_unpacklo_epi8 (tmpSrc0_epi8, tmpSrc1_epi8));

            _mm_storeu_si128 (
                &dst_epi8[2 * x + 1],
                _mm_unpackhi_epi8 (tmpSrc0_epi8, tmpSrc1_epi8));
        }

        //
        // Then do run the leftovers one at a time
        //

        for (int x = 16 * sseWidth; x < numBytes; ++x)
        {
            dst[2 * x]     = src0[x];
            dst[2 * x + 1] = src1[x];
        }
    }
}